

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O0

shared_ptr<chaiscript::dispatch::Proxy_Function_Base>
chaiscript::
make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value(*)(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&)>,chaiscript::Boxed_Value(*)(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&)>
          (_func_Boxed_Value_vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_ptr
           **arg)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Param_Types *in_RSI;
  element_type *in_RDI;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> sVar1;
  int unaff_retaddr;
  _func_Boxed_Value_vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_ptr
  *in_stack_00000008;
  Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_&)>
  *in_stack_00000010;
  Proxy_Function *in_stack_00000020;
  Proxy_Function_Base *__p;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *in_stack_ffffffffffffff20;
  Param_Types *in_stack_ffffffffffffff30;
  allocator *paVar2;
  undefined1 local_a0 [24];
  string local_88 [112];
  string *in_stack_ffffffffffffffe8;
  element_type *t_parsenode;
  
  t_parsenode = in_RDI;
  operator_new(0xa8);
  std::shared_ptr<chaiscript::AST_Node>::shared_ptr((shared_ptr<chaiscript::AST_Node> *)0x3b3815);
  dispatch::Param_Types::Param_Types(in_stack_ffffffffffffff30);
  paVar2 = (allocator *)(local_a0 + 0x17);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"",paVar2);
  __p = (Proxy_Function_Base *)local_a0;
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x3b385a);
  dispatch::
  Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_&)>
  ::Dynamic_Proxy_Function_Impl
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,(AST_NodePtr *)t_parsenode,in_RSI,
             in_stack_ffffffffffffffe8,in_stack_00000020);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base,void>(in_stack_ffffffffffffff20,__p);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x3b38b0);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)(local_a0 + 0x17));
  dispatch::Param_Types::~Param_Types((Param_Types *)0x3b38d1);
  std::shared_ptr<chaiscript::AST_Node>::~shared_ptr((shared_ptr<chaiscript::AST_Node> *)0x3b38de);
  sVar1.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (shared_ptr<chaiscript::dispatch::Proxy_Function_Base>)
         sVar1.
         super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<B> make_shared(Arg && ... arg)
  {
#ifdef CHAISCRIPT_USE_STD_MAKE_SHARED
    return std::make_shared<D>(std::forward<Arg>(arg)...);
#else
    return std::shared_ptr<B>(static_cast<B*>(new D(std::forward<Arg>(arg)...)));
#endif
  }